

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

xmlChar * htmlParseHTMLAttribute(htmlParserCtxtPtr ctxt,xmlChar stop)

{
  xmlChar *pxVar1;
  bool bVar2;
  xmlChar *tmp_4;
  int indx_4;
  int l;
  int bits_2;
  uint c_2;
  xmlChar *tmp_3;
  int local_90;
  int indx_3;
  int bits_1;
  uint c_1;
  xmlChar *tmp_2;
  xmlChar *pxStack_78;
  int indx_2;
  xmlChar *tmp_1;
  xmlChar *pxStack_68;
  int indx_1;
  xmlChar *tmp;
  int local_58;
  int indx;
  int bits;
  uint c;
  htmlEntityDesc *ent;
  xmlChar *cur;
  xmlChar *name;
  xmlChar *out;
  xmlChar *pxStack_28;
  int buffer_size;
  xmlChar *buffer;
  htmlParserCtxtPtr pxStack_18;
  xmlChar stop_local;
  htmlParserCtxtPtr ctxt_local;
  
  pxStack_28 = (xmlChar *)0x0;
  name = (xmlChar *)0x0;
  cur = (xmlChar *)0x0;
  ent = (htmlEntityDesc *)0x0;
  out._4_4_ = 100;
  buffer._7_1_ = stop;
  pxStack_18 = ctxt;
  pxStack_28 = (xmlChar *)(*xmlMallocAtomic)(100);
  pxVar1 = pxStack_28;
  if (pxStack_28 == (xmlChar *)0x0) {
    htmlErrMemory(pxStack_18,"buffer allocation failed\n");
  }
  else {
    while( true ) {
      do {
        while( true ) {
          while( true ) {
            while( true ) {
              name = pxVar1;
              bVar2 = false;
              if (*pxStack_18->input->cur != '\0') {
                bVar2 = *pxStack_18->input->cur != buffer._7_1_;
              }
              if (((!bVar2) || ((buffer._7_1_ == '\0' && (*pxStack_18->input->cur == '>')))) ||
                 ((buffer._7_1_ == '\0' &&
                  ((*pxStack_18->input->cur == ' ' ||
                   (((8 < *pxStack_18->input->cur && (*pxStack_18->input->cur < 0xb)) ||
                    (*pxStack_18->input->cur == '\r')))))))) {
                *name = '\0';
                return pxStack_28;
              }
              if (*pxStack_18->input->cur == '&') break;
              if ((long)(out._4_4_ + -100) < (long)name - (long)pxStack_28) {
                tmp_4._0_4_ = (int)name - (int)pxStack_28;
                out._4_4_ = out._4_4_ << 1;
                pxVar1 = (xmlChar *)(*xmlRealloc)(pxStack_28,(long)out._4_4_);
                if (pxVar1 == (xmlChar *)0x0) {
                  htmlErrMemory(pxStack_18,"growing buffer\n");
                  (*xmlFree)(pxStack_28);
                  return (xmlChar *)0x0;
                }
                name = pxVar1 + (int)tmp_4;
                pxStack_28 = pxVar1;
              }
              l = htmlCurrentChar(pxStack_18,(int *)((long)&tmp_4 + 4));
              if ((uint)l < 0x80) {
                *name = (xmlChar)l;
                indx_4 = -6;
              }
              else if ((uint)l < 0x800) {
                *name = (byte)((uint)l >> 6) & 0x1f | 0xc0;
                indx_4 = 0;
              }
              else if ((uint)l < 0x10000) {
                *name = (byte)((uint)l >> 0xc) & 0xf | 0xe0;
                indx_4 = 6;
              }
              else {
                *name = (byte)((uint)l >> 0x12) & 7 | 0xf0;
                indx_4 = 0xc;
              }
              for (; name = name + 1, -1 < indx_4; indx_4 = indx_4 + -6) {
                *name = (byte)((uint)l >> ((byte)indx_4 & 0x1f)) & 0x3f | 0x80;
              }
              xmlNextChar(pxStack_18);
              pxVar1 = name;
            }
            if (pxStack_18->input->cur[1] != '#') break;
            indx = htmlParseCharRef(pxStack_18);
            if ((uint)indx < 0x80) {
              *name = (xmlChar)indx;
              local_58 = -6;
            }
            else if ((uint)indx < 0x800) {
              *name = (byte)((uint)indx >> 6) & 0x1f | 0xc0;
              local_58 = 0;
            }
            else if ((uint)indx < 0x10000) {
              *name = (byte)((uint)indx >> 0xc) & 0xf | 0xe0;
              local_58 = 6;
            }
            else {
              *name = (byte)((uint)indx >> 0x12) & 7 | 0xf0;
              local_58 = 0xc;
            }
            for (; name = name + 1, -1 < local_58; local_58 = local_58 + -6) {
              *name = (byte)((uint)indx >> ((byte)local_58 & 0x1f)) & 0x3f | 0x80;
            }
            pxVar1 = name;
            if ((long)(out._4_4_ + -100) < (long)name - (long)pxStack_28) {
              tmp._4_4_ = (int)name - (int)pxStack_28;
              out._4_4_ = out._4_4_ << 1;
              pxStack_68 = (xmlChar *)(*xmlRealloc)(pxStack_28,(long)out._4_4_);
              if (pxStack_68 == (xmlChar *)0x0) {
                htmlErrMemory(pxStack_18,"growing buffer\n");
                (*xmlFree)(pxStack_28);
                return (xmlChar *)0x0;
              }
              pxVar1 = pxStack_68 + tmp._4_4_;
              pxStack_28 = pxStack_68;
            }
          }
          _bits = htmlParseEntityRef(pxStack_18,&cur);
          if (cur == (xmlChar *)0x0) break;
          if (_bits == (htmlEntityDesc *)0x0) {
            *name = '&';
            for (ent = (htmlEntityDesc *)cur; name = name + 1, pxVar1 = name,
                (char)ent->value != '\0'; ent = (htmlEntityDesc *)((long)&ent->value + 1)) {
              if ((long)(out._4_4_ + -100) < (long)name - (long)pxStack_28) {
                tmp_2._4_4_ = (int)name - (int)pxStack_28;
                out._4_4_ = out._4_4_ << 1;
                _bits_1 = (xmlChar *)(*xmlRealloc)(pxStack_28,(long)out._4_4_);
                if (_bits_1 == (xmlChar *)0x0) {
                  htmlErrMemory(pxStack_18,"growing buffer\n");
                  (*xmlFree)(pxStack_28);
                  return (xmlChar *)0x0;
                }
                name = _bits_1 + tmp_2._4_4_;
                pxStack_28 = _bits_1;
              }
              *name = (xmlChar)ent->value;
            }
          }
          else {
            if ((long)(out._4_4_ + -100) < (long)name - (long)pxStack_28) {
              tmp_3._4_4_ = (int)name - (int)pxStack_28;
              out._4_4_ = out._4_4_ << 1;
              _bits_2 = (xmlChar *)(*xmlRealloc)(pxStack_28,(long)out._4_4_);
              if (_bits_2 == (xmlChar *)0x0) {
                htmlErrMemory(pxStack_18,"growing buffer\n");
                (*xmlFree)(pxStack_28);
                return (xmlChar *)0x0;
              }
              name = _bits_2 + tmp_3._4_4_;
              pxStack_28 = _bits_2;
            }
            indx_3 = _bits->value;
            if ((uint)indx_3 < 0x80) {
              *name = (xmlChar)indx_3;
              local_90 = -6;
            }
            else if ((uint)indx_3 < 0x800) {
              *name = (byte)((uint)indx_3 >> 6) & 0x1f | 0xc0;
              local_90 = 0;
            }
            else if ((uint)indx_3 < 0x10000) {
              *name = (byte)((uint)indx_3 >> 0xc) & 0xf | 0xe0;
              local_90 = 6;
            }
            else {
              *name = (byte)((uint)indx_3 >> 0x12) & 7 | 0xf0;
              local_90 = 0xc;
            }
            for (; name = name + 1, pxVar1 = name, -1 < local_90; local_90 = local_90 + -6) {
              *name = (byte)((uint)indx_3 >> ((byte)local_90 & 0x1f)) & 0x3f | 0x80;
            }
          }
        }
        pxVar1 = name + 1;
        *name = '&';
      } while ((long)pxVar1 - (long)pxStack_28 <= (long)(out._4_4_ + -100));
      tmp_1._4_4_ = (int)pxVar1 - (int)pxStack_28;
      out._4_4_ = out._4_4_ << 1;
      name = pxVar1;
      pxStack_78 = (xmlChar *)(*xmlRealloc)(pxStack_28,(long)out._4_4_);
      if (pxStack_78 == (xmlChar *)0x0) break;
      pxVar1 = pxStack_78 + tmp_1._4_4_;
      pxStack_28 = pxStack_78;
    }
    htmlErrMemory(pxStack_18,"growing buffer\n");
    (*xmlFree)(pxStack_28);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
htmlParseHTMLAttribute(htmlParserCtxtPtr ctxt, const xmlChar stop) {
    xmlChar *buffer = NULL;
    int buffer_size = 0;
    xmlChar *out = NULL;
    const xmlChar *name = NULL;
    const xmlChar *cur = NULL;
    const htmlEntityDesc * ent;

    /*
     * allocate a translation buffer.
     */
    buffer_size = HTML_PARSER_BUFFER_SIZE;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) {
	htmlErrMemory(ctxt, "buffer allocation failed\n");
	return(NULL);
    }
    out = buffer;

    /*
     * Ok loop until we reach one of the ending chars
     */
    while ((CUR != 0) && (CUR != stop)) {
	if ((stop == 0) && (CUR == '>')) break;
	if ((stop == 0) && (IS_BLANK_CH(CUR))) break;
        if (CUR == '&') {
	    if (NXT(1) == '#') {
		unsigned int c;
		int bits;

		c = htmlParseCharRef(ctxt);
		if      (c <    0x80)
		        { *out++  = c;                bits= -6; }
		else if (c <   0x800)
		        { *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
		else if (c < 0x10000)
		        { *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
		else
		        { *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

		for ( ; bits >= 0; bits-= 6) {
		    *out++  = ((c >> bits) & 0x3F) | 0x80;
		}

		if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		}
	    } else {
		ent = htmlParseEntityRef(ctxt, &name);
		if (name == NULL) {
		    *out++ = '&';
		    if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		    }
		} else if (ent == NULL) {
		    *out++ = '&';
		    cur = name;
		    while (*cur != 0) {
			if (out - buffer > buffer_size - 100) {
			    int indx = out - buffer;

			    growBuffer(buffer);
			    out = &buffer[indx];
			}
			*out++ = *cur++;
		    }
		} else {
		    unsigned int c;
		    int bits;

		    if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		    }
		    c = ent->value;
		    if      (c <    0x80)
			{ *out++  = c;                bits= -6; }
		    else if (c <   0x800)
			{ *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
		    else if (c < 0x10000)
			{ *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
		    else
			{ *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

		    for ( ; bits >= 0; bits-= 6) {
			*out++  = ((c >> bits) & 0x3F) | 0x80;
		    }
		}
	    }
	} else {
	    unsigned int c;
	    int bits, l;

	    if (out - buffer > buffer_size - 100) {
		int indx = out - buffer;

		growBuffer(buffer);
		out = &buffer[indx];
	    }
	    c = CUR_CHAR(l);
	    if      (c <    0x80)
		    { *out++  = c;                bits= -6; }
	    else if (c <   0x800)
		    { *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
	    else if (c < 0x10000)
		    { *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
	    else
		    { *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

	    for ( ; bits >= 0; bits-= 6) {
		*out++  = ((c >> bits) & 0x3F) | 0x80;
	    }
	    NEXT;
	}
    }
    *out = 0;
    return(buffer);
}